

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeedForwardNN.h
# Opt level: O3

void __thiscall
nnad::FeedForwardNN<double>::FeedForwardNN
          (FeedForwardNN<double> *this,vector<int,_std::allocator<int>_> *Arch,int *RandomSeed,
          bool *Report,function<double_(const_double_&)> *ActFun,
          function<double_(const_double_&)> *dActFun,OutputFunction *OutputFunc,
          Preprocessing *Preproc,vector<double,_std::allocator<double>_> *PreprocPars)

{
  pointer **pppdVar1;
  _Rb_tree_header *p_Var2;
  OutputFunction OVar3;
  int *piVar4;
  _Manager_type p_Var5;
  bool bVar6;
  FeedForwardNN<double> *pFVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  undefined8 *puVar12;
  long *plVar13;
  pointer piVar14;
  ostream *poVar15;
  undefined8 uVar16;
  ulong uVar17;
  long *plVar18;
  pointer *ppdVar19;
  ulong *puVar20;
  uint uVar21;
  _Head_base<3UL,_int,_false> __val;
  int iVar22;
  long lVar23;
  int *piVar24;
  undefined1 auVar25 [8];
  pointer pdVar26;
  uint uVar27;
  _Head_base<3UL,_int,_false> _Var28;
  int *n;
  long lVar29;
  int *piVar30;
  vector<int,_std::allocator<int>_> *__range3;
  uint __uval;
  string name;
  string name_1;
  string __str;
  vector<int,_std::allocator<int>_> sub_seeds;
  string __str_3;
  string __str_2;
  string __str_1;
  undefined1 local_228 [8];
  _Alloc_hider local_220;
  undefined1 local_218 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_210;
  _Head_base<1UL,_int,_false> local_200;
  _Head_base<0UL,_bool,_false> local_1fc;
  undefined2 local_1fb;
  undefined1 local_1f9;
  FeedForwardNN<double> *local_1f8;
  uint local_1ec;
  Matrix<double> local_1e8;
  undefined2 local_1be;
  undefined1 local_1bc;
  undefined2 local_1bb;
  undefined1 local_1b9;
  vector<double,_std::allocator<double>_> local_1b8;
  undefined8 uStack_1a0;
  ulong local_198;
  pointer *local_190;
  long local_188;
  pointer local_180;
  long lStack_178;
  long *local_170;
  undefined8 local_168;
  long local_160;
  undefined8 uStack_158;
  uint local_14c;
  vector<int,_std::allocator<int>_> local_148;
  _Any_data *local_130;
  _Any_data *local_128;
  _Rb_tree<int,std::pair<int_const,std::__cxx11::string>,std::_Select1st<std::pair<int_const,std::__cxx11::string>>,std::less<int>,std::allocator<std::pair<int_const,std::__cxx11::string>>>
  *local_120;
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::tuple<bool,int,int,int>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::tuple<bool,int,int,int>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::tuple<bool,int,int,int>>>>
  *local_118;
  _Rb_tree<int,std::pair<int_const,std::tuple<bool,int,int,int>>,std::_Select1st<std::pair<int_const,std::tuple<bool,int,int,int>>>,std::less<int>,std::allocator<std::pair<int_const,std::tuple<bool,int,int,int>>>>
  *local_110;
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::_Select1st<std::pair<std::__cxx11::string_const,int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
  *local_108;
  ulong local_100;
  pointer *local_f8;
  long local_f0;
  pointer local_e8 [2];
  pointer *local_d8;
  long local_d0;
  pointer local_c8 [2];
  bool *local_b8;
  int *local_b0;
  _Any_data *local_a8;
  _Any_data *local_a0;
  _Any_data *local_98;
  vector<double,_std::allocator<double>_> *local_90;
  _Rb_tree<int,std::pair<int_const,nnad::Matrix<double>>,std::_Select1st<std::pair<int_const,nnad::Matrix<double>>>,std::less<int>,std::allocator<std::pair<int_const,nnad::Matrix<double>>>>
  *local_88;
  _Rb_tree<int,std::pair<int_const,nnad::Matrix<double>>,std::_Select1st<std::pair<int_const,nnad::Matrix<double>>>,std::less<int>,std::allocator<std::pair<int_const,nnad::Matrix<double>>>>
  *local_80;
  ulong local_78;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  long *local_50 [2];
  long local_40 [2];
  
  std::vector<int,_std::allocator<int>_>::vector(&this->_Arch,Arch);
  local_a8 = (_Any_data *)&this->_ActFun;
  std::function<double_(const_double_&)>::function
            ((function<double_(const_double_&)> *)local_a8,ActFun);
  local_a0 = (_Any_data *)&this->_dActFun;
  std::function<double_(const_double_&)>::function
            ((function<double_(const_double_&)> *)local_a0,dActFun);
  this->_OutputFunc = *OutputFunc;
  local_98 = (_Any_data *)&this->_Preproc;
  std::
  function<std::vector<double,_std::allocator<double>_>_(const_std::vector<double,_std::allocator<double>_>_&,_const_std::vector<double,_std::allocator<double>_>_&)>
  ::function((function<std::vector<double,_std::allocator<double>_>_(const_std::vector<double,_std::allocator<double>_>_&,_const_std::vector<double,_std::allocator<double>_>_&)>
              *)local_98,Preproc);
  local_90 = &this->_PreprocPars;
  if ((this->_Preproc).super__Function_base._M_manager == (_Manager_type)0x0) {
    (local_90->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    (this->_PreprocPars).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (this->_PreprocPars).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    iVar22 = 0;
  }
  else {
    std::vector<double,_std::allocator<double>_>::vector(local_90,PreprocPars);
    iVar22 = (int)((ulong)((long)(this->_PreprocPars).
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_finish -
                          (long)(this->_PreprocPars).
                                super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_start) >> 3);
  }
  this->_NpPrep = iVar22;
  local_130 = (_Any_data *)&this->_OutputActFun;
  local_128 = (_Any_data *)&this->_dOutputActFun;
  local_80 = (_Rb_tree<int,std::pair<int_const,nnad::Matrix<double>>,std::_Select1st<std::pair<int_const,nnad::Matrix<double>>>,std::less<int>,std::allocator<std::pair<int_const,nnad::Matrix<double>>>>
              *)&this->_Links;
  p_Var2 = &(this->_Links)._M_t._M_impl.super__Rb_tree_header;
  (this->_Links)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->_Links)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  *(undefined8 *)&(this->_OutputActFun).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->_OutputActFun).super__Function_base._M_functor + 8) = 0;
  (this->_OutputActFun).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->_OutputActFun)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->_dOutputActFun).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->_dOutputActFun).super__Function_base._M_functor + 8) = 0;
  (this->_dOutputActFun).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->_dOutputActFun)._M_invoker = (_Invoker_type)0x0;
  (this->_Links)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  (this->_Links)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  (this->_Links)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_88 = (_Rb_tree<int,std::pair<int_const,nnad::Matrix<double>>,std::_Select1st<std::pair<int_const,nnad::Matrix<double>>>,std::less<int>,std::allocator<std::pair<int_const,nnad::Matrix<double>>>>
              *)&this->_Biases;
  p_Var2 = &(this->_Biases)._M_t._M_impl.super__Rb_tree_header;
  (this->_Biases)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->_Biases)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->_Biases)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  (this->_Biases)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  (this->_Biases)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_110 = (_Rb_tree<int,std::pair<int_const,std::tuple<bool,int,int,int>>,std::_Select1st<std::pair<int_const,std::tuple<bool,int,int,int>>>,std::less<int>,std::allocator<std::pair<int_const,std::tuple<bool,int,int,int>>>>
               *)&this->_IntMap;
  p_Var2 = &(this->_IntMap)._M_t._M_impl.super__Rb_tree_header;
  (this->_IntMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->_IntMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->_IntMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  (this->_IntMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  (this->_IntMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_118 = (_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::tuple<bool,int,int,int>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::tuple<bool,int,int,int>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::tuple<bool,int,int,int>>>>
               *)&this->_StrMap;
  p_Var2 = &(this->_StrMap)._M_t._M_impl.super__Rb_tree_header;
  (this->_StrMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->_StrMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->_StrMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  (this->_StrMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  (this->_StrMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_108 = (_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::_Select1st<std::pair<std::__cxx11::string_const,int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
               *)&this->_StrIntMap;
  p_Var2 = &(this->_StrIntMap)._M_t._M_impl.super__Rb_tree_header;
  (this->_StrIntMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->_StrIntMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->_StrIntMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  (this->_StrIntMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  (this->_StrIntMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_120 = (_Rb_tree<int,std::pair<int_const,std::__cxx11::string>,std::_Select1st<std::pair<int_const,std::__cxx11::string>>,std::less<int>,std::allocator<std::pair<int_const,std::__cxx11::string>>>
               *)&this->_IntStrMap;
  p_Var2 = &(this->_IntStrMap)._M_t._M_impl.super__Rb_tree_header;
  (this->_IntStrMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->_IntStrMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->_IntStrMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  (this->_IntStrMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  (this->_IntStrMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  uVar11 = (ulong)((long)(this->_Arch).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                  (long)(this->_Arch).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start) >> 2;
  srand(*RandomSeed);
  local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (int *)0x0;
  local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (int *)0x0;
  iVar22 = (int)uVar11;
  local_1f8 = this;
  if (iVar22 < 2) {
    this->_Np = 0;
    piVar24 = &this->_Np;
  }
  else {
    iVar22 = iVar22 + -1;
    local_198 = uVar11;
    do {
      iVar8 = rand();
      local_228._0_4_ = iVar8;
      if (local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish ==
          local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (&local_148,
                   (iterator)
                   local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish,(int *)local_228);
      }
      else {
        *local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish = iVar8;
        local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish + 1;
      }
      local_228._0_4_ = rand();
      if (local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish ==
          local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (&local_148,
                   (iterator)
                   local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish,(int *)local_228);
      }
      else {
        *local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish = local_228._0_4_;
        local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish + 1;
      }
      iVar22 = iVar22 + -1;
    } while (iVar22 != 0);
    this->_Np = 0;
    iVar22 = (int)local_198;
    piVar24 = &this->_Np;
    if (1 < iVar22) {
      iVar8 = 1;
      lVar29 = 4;
      uVar11 = 0;
      lVar23 = 4;
      local_b8 = Report;
      local_b0 = &this->_Np;
      do {
        if ((ulong)((long)local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start >> 2) <= uVar11) {
LAB_001068a5:
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                     uVar11);
          goto LAB_001068b6;
        }
        piVar14 = (local_1f8->_Arch).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        Matrix<double>::Matrix
                  (&local_1e8,(int *)((long)piVar14 + lVar23),(int *)((long)piVar14 + lVar23 + -4),
                   (int *)((long)local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start + lVar29 + -4));
        local_228._0_4_ = iVar8;
        local_220._M_p = (pointer)local_1e8._0_8_;
        std::vector<double,_std::allocator<double>_>::vector
                  ((vector<double,_std::allocator<double>_> *)local_218,&local_1e8._Matrix);
        std::
        _Rb_tree<int,std::pair<int_const,nnad::Matrix<double>>,std::_Select1st<std::pair<int_const,nnad::Matrix<double>>>,std::less<int>,std::allocator<std::pair<int_const,nnad::Matrix<double>>>>
        ::_M_insert_unique<std::pair<int_const,nnad::Matrix<double>>>
                  (local_80,(pair<const_int,_nnad::Matrix<double>_> *)local_228);
        if (local_218 != (undefined1  [8])0x0) {
          operator_delete((void *)local_218,
                          CONCAT44(aStack_210._12_4_,aStack_210._8_4_) - (long)local_218);
        }
        if (local_1e8._Matrix.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != (double *)0x0) {
          operator_delete(local_1e8._Matrix.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)local_1e8._Matrix.
                                super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_1e8._Matrix.
                                super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        local_1b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)CONCAT44(local_1b8.super__Vector_base<double,_std::allocator<double>_>._M_impl
                               .super__Vector_impl_data._M_start._4_4_,1);
        if ((ulong)((long)local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start >> 2) <= uVar11 + 1) {
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
          goto LAB_001068a5;
        }
        Matrix<double>::Matrix
                  (&local_1e8,
                   (int *)((long)(local_1f8->_Arch).super__Vector_base<int,_std::allocator<int>_>.
                                 _M_impl.super__Vector_impl_data._M_start + lVar23),
                   (int *)&local_1b8,
                   (int *)((long)local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start + lVar29));
        local_220._M_p = (pointer)local_1e8._0_8_;
        std::vector<double,_std::allocator<double>_>::vector
                  ((vector<double,_std::allocator<double>_> *)local_218,&local_1e8._Matrix);
        std::
        _Rb_tree<int,std::pair<int_const,nnad::Matrix<double>>,std::_Select1st<std::pair<int_const,nnad::Matrix<double>>>,std::less<int>,std::allocator<std::pair<int_const,nnad::Matrix<double>>>>
        ::_M_insert_unique<std::pair<int_const,nnad::Matrix<double>>>
                  (local_88,(pair<const_int,_nnad::Matrix<double>_> *)local_228);
        if (local_218 != (undefined1  [8])0x0) {
          operator_delete((void *)local_218,
                          CONCAT44(aStack_210._12_4_,aStack_210._8_4_) - (long)local_218);
        }
        if (local_1e8._Matrix.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != (double *)0x0) {
          operator_delete(local_1e8._Matrix.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)local_1e8._Matrix.
                                super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_1e8._Matrix.
                                super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        piVar14 = (local_1f8->_Arch).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        uVar11 = uVar11 + 2;
        local_1f8->_Np =
             local_1f8->_Np +
             (*(int *)((long)piVar14 + lVar23 + -4) + 1) * *(int *)((long)piVar14 + lVar23);
        iVar8 = iVar8 + 1;
        lVar23 = lVar23 + 4;
        lVar29 = lVar29 + 8;
      } while ((ulong)(uint)(iVar22 * 2) - 2 != uVar11);
      piVar24 = local_b0;
      Report = local_b8;
      this = local_1f8;
      if (1 < (int)(uint)local_198) {
        piVar14 = (local_1f8->_Arch).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        _Var28._M_head_impl = 0;
        uVar11 = (ulong)((uint)local_198 & 0x7fffffff);
        do {
          uVar17 = uVar11 - 1;
          local_100 = uVar11;
          if (0 < piVar14[uVar11 - 1]) {
            uVar27 = (uint)uVar17;
            local_1ec = -uVar27;
            if (0 < (int)uVar27) {
              local_1ec = uVar27;
            }
            local_78 = uVar17 >> 0x1f & 1;
            uVar27 = 0;
            local_198 = uVar17;
            do {
              uVar11 = local_78;
              uVar21 = 1;
              if (9 < local_1ec) {
                uVar9 = local_1ec;
                uVar10 = 4;
                do {
                  uVar21 = uVar10;
                  if (uVar9 < 100) {
                    uVar21 = uVar21 - 2;
                    goto LAB_00105821;
                  }
                  if (uVar9 < 1000) {
                    uVar21 = uVar21 - 1;
                    goto LAB_00105821;
                  }
                  if (uVar9 < 10000) goto LAB_00105821;
                  bVar6 = 99999 < uVar9;
                  uVar9 = uVar9 / 10000;
                  uVar10 = uVar21 + 4;
                } while (bVar6);
                uVar21 = uVar21 + 1;
              }
LAB_00105821:
              local_170 = &local_160;
              local_14c = uVar27;
              std::__cxx11::string::_M_construct((ulong)&local_170,(char)local_78 + (char)uVar21);
              std::__detail::__to_chars_10_impl<unsigned_int>
                        ((char *)((long)local_170 + uVar11),uVar21,local_1ec);
              puVar12 = (undefined8 *)
                        std::__cxx11::string::replace((ulong)&local_170,0,(char *)0x0,0x10916a);
              uVar27 = local_14c;
              this = local_1f8;
              local_1b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start =
                   (pointer)&local_1b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage;
              plVar13 = puVar12 + 2;
              if ((pointer *)*puVar12 == (pointer *)plVar13) {
                local_1b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage = (pointer)*plVar13;
                uStack_1a0 = puVar12[3];
              }
              else {
                local_1b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage = (pointer)*plVar13;
                local_1b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start = (pointer)*puVar12;
              }
              local_1b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)puVar12[1];
              *puVar12 = plVar13;
              puVar12[1] = 0;
              *(undefined1 *)(puVar12 + 2) = 0;
              plVar13 = (long *)std::__cxx11::string::append((char *)&local_1b8);
              local_228 = (undefined1  [8])local_218;
              plVar18 = plVar13 + 2;
              if ((long *)*plVar13 == plVar18) {
                local_218 = (undefined1  [8])*plVar18;
                aStack_210._M_allocated_capacity = plVar13[3];
              }
              else {
                local_218 = (undefined1  [8])*plVar18;
                local_228 = (undefined1  [8])*plVar13;
              }
              local_220._M_p = (pointer)plVar13[1];
              *plVar13 = (long)plVar18;
              plVar13[1] = 0;
              *(undefined1 *)(plVar13 + 2) = 0;
              uVar21 = 1;
              if (9 < uVar27) {
                uVar9 = uVar27;
                uVar10 = 4;
                do {
                  uVar21 = uVar10;
                  if (uVar9 < 100) {
                    uVar21 = uVar21 - 2;
                    goto LAB_0010597d;
                  }
                  if (uVar9 < 1000) {
                    uVar21 = uVar21 - 1;
                    goto LAB_0010597d;
                  }
                  if (uVar9 < 10000) goto LAB_0010597d;
                  bVar6 = 99999 < uVar9;
                  uVar9 = uVar9 / 10000;
                  uVar10 = uVar21 + 4;
                } while (bVar6);
                uVar21 = uVar21 + 1;
              }
LAB_0010597d:
              local_190 = &local_180;
              std::__cxx11::string::_M_construct((ulong)&local_190,(char)uVar21);
              std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_190,uVar21,uVar27);
              uVar11 = local_198;
              auVar25 = (undefined1  [8])(pointer)0xf;
              if (local_228 != (undefined1  [8])local_218) {
                auVar25 = local_218;
              }
              if ((ulong)auVar25 < local_220._M_p + local_188) {
                pdVar26 = (pointer)0xf;
                if (local_190 != &local_180) {
                  pdVar26 = local_180;
                }
                if (pdVar26 < local_220._M_p + local_188) goto LAB_00105a10;
                puVar12 = (undefined8 *)
                          std::__cxx11::string::replace
                                    ((ulong)&local_190,0,(char *)0x0,(ulong)local_228);
              }
              else {
LAB_00105a10:
                puVar12 = (undefined8 *)std::__cxx11::string::_M_append(local_228,(ulong)local_190);
              }
              local_1e8._0_8_ =
                   &local_1e8._Matrix.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish;
              pppdVar1 = (pointer **)(puVar12 + 2);
              if ((pointer **)*puVar12 == pppdVar1) {
                local_1e8._Matrix.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish = (pointer)*pppdVar1;
                local_1e8._Matrix.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage = (pointer)puVar12[3];
              }
              else {
                local_1e8._Matrix.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish = (pointer)*pppdVar1;
                local_1e8._0_8_ = (pointer **)*puVar12;
              }
              local_1e8._Matrix.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)puVar12[1];
              *puVar12 = pppdVar1;
              puVar12[1] = 0;
              *(undefined1 *)pppdVar1 = 0;
              if (local_190 != &local_180) {
                operator_delete(local_190,(long)local_180 + 1);
              }
              if (local_228 != (undefined1  [8])local_218) {
                operator_delete((void *)local_228,(long)local_218 + 1);
              }
              if ((pointer *)
                  local_1b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start !=
                  &local_1b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage) {
                operator_delete(local_1b8.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                                (long)local_1b8.super__Vector_base<double,_std::allocator<double>_>.
                                      _M_impl.super__Vector_impl_data._M_end_of_storage + 1);
              }
              if (local_170 != &local_160) {
                operator_delete(local_170,local_160 + 1);
              }
              local_228 = (undefined1  [8])local_218;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)local_228,local_1e8._0_8_,
                         (undefined1 *)
                         ((long)local_1e8._Matrix.
                                super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_start + local_1e8._0_8_));
              aStack_210._8_4_ = _Var28._M_head_impl;
              std::
              _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::_Select1st<std::pair<std::__cxx11::string_const,int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
              ::_M_insert_unique<std::pair<std::__cxx11::string_const,int>>
                        (local_108,
                         (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
                          *)local_228);
              if (local_228 != (undefined1  [8])local_218) {
                operator_delete((void *)local_228,(long)local_218 + 1);
              }
              local_228._4_4_ = 0;
              local_228._0_4_ = _Var28._M_head_impl;
              local_220._M_p._4_4_ = (int)uVar11;
              local_220._M_p._0_4_ = uVar27;
              local_218 = (undefined1  [8])
                          ((ulong)CONCAT52(CONCAT41(local_218._4_4_,local_1b9),local_1bb) << 8);
              std::
              _Rb_tree<int,std::pair<int_const,std::tuple<bool,int,int,int>>,std::_Select1st<std::pair<int_const,std::tuple<bool,int,int,int>>>,std::less<int>,std::allocator<std::pair<int_const,std::tuple<bool,int,int,int>>>>
              ::_M_insert_unique<std::pair<int_const,std::tuple<bool,int,int,int>>>
                        (local_110,(pair<const_int,_std::tuple<bool,_int,_int,_int>_> *)local_228);
              local_228 = (undefined1  [8])local_218;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)local_228,local_1e8._0_8_,
                         (undefined1 *)
                         ((long)local_1e8._Matrix.
                                super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_start + local_1e8._0_8_));
              aStack_210._8_4_ = 0;
              aStack_210._12_4_ = uVar27;
              local_1fc._M_head_impl = false;
              local_1f9 = local_1b9;
              local_1fb = local_1bb;
              local_200._M_head_impl = (int)uVar11;
              std::
              _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::tuple<bool,int,int,int>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::tuple<bool,int,int,int>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::tuple<bool,int,int,int>>>>
              ::_M_insert_unique<std::pair<std::__cxx11::string_const,std::tuple<bool,int,int,int>>>
                        (local_118,
                         (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<bool,_int,_int,_int>_>
                          *)local_228);
              if (local_228 != (undefined1  [8])local_218) {
                operator_delete((void *)local_228,(long)local_218 + 1);
              }
              local_220._M_p = local_218 + 8;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_220,local_1e8._0_8_,
                         (undefined1 *)
                         ((long)local_1e8._Matrix.
                                super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_start + local_1e8._0_8_));
              std::
              _Rb_tree<int,std::pair<int_const,std::__cxx11::string>,std::_Select1st<std::pair<int_const,std::__cxx11::string>>,std::less<int>,std::allocator<std::pair<int_const,std::__cxx11::string>>>
              ::_M_insert_unique<std::pair<int_const,std::__cxx11::string>>
                        (local_120,
                         (pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)local_228);
              if (local_220._M_p != local_218 + 8) {
                operator_delete(local_220._M_p,aStack_210._0_8_ + 1);
              }
              _Var28._M_head_impl = _Var28._M_head_impl + 1;
              piVar14 = (this->_Arch).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start;
              if (0 < piVar14[local_100 - 2]) {
                __val._M_head_impl = 0;
                do {
                  uVar11 = local_78;
                  uVar27 = 1;
                  if (9 < local_1ec) {
                    uVar21 = local_1ec;
                    uVar9 = 4;
                    do {
                      uVar27 = uVar9;
                      if (uVar21 < 100) {
                        uVar27 = uVar27 - 2;
                        goto LAB_00105cc1;
                      }
                      if (uVar21 < 1000) {
                        uVar27 = uVar27 - 1;
                        goto LAB_00105cc1;
                      }
                      if (uVar21 < 10000) goto LAB_00105cc1;
                      bVar6 = 99999 < uVar21;
                      uVar21 = uVar21 / 10000;
                      uVar9 = uVar27 + 4;
                    } while (bVar6);
                    uVar27 = uVar27 + 1;
                  }
LAB_00105cc1:
                  local_50[0] = local_40;
                  std::__cxx11::string::_M_construct((ulong)local_50,(char)local_78 + (char)uVar27);
                  std::__detail::__to_chars_10_impl<unsigned_int>
                            ((char *)((long)local_50[0] + uVar11),uVar27,local_1ec);
                  plVar13 = (long *)std::__cxx11::string::replace
                                              ((ulong)local_50,0,(char *)0x0,0x10916d);
                  local_70 = &local_60;
                  plVar18 = plVar13 + 2;
                  if ((long *)*plVar13 == plVar18) {
                    local_60 = *plVar18;
                    lStack_58 = plVar13[3];
                  }
                  else {
                    local_60 = *plVar18;
                    local_70 = (long *)*plVar13;
                  }
                  local_68 = plVar13[1];
                  *plVar13 = (long)plVar18;
                  plVar13[1] = 0;
                  *(undefined1 *)(plVar13 + 2) = 0;
                  plVar13 = (long *)std::__cxx11::string::append((char *)&local_70);
                  uVar27 = local_14c;
                  local_190 = &local_180;
                  ppdVar19 = (pointer *)(plVar13 + 2);
                  if ((pointer *)*plVar13 == ppdVar19) {
                    local_180 = *ppdVar19;
                    lStack_178 = plVar13[3];
                  }
                  else {
                    local_180 = *ppdVar19;
                    local_190 = (pointer *)*plVar13;
                  }
                  local_188 = plVar13[1];
                  *plVar13 = (long)ppdVar19;
                  plVar13[1] = 0;
                  *(undefined1 *)(plVar13 + 2) = 0;
                  uVar21 = 1;
                  if (9 < local_14c) {
                    uVar9 = local_14c;
                    uVar10 = 4;
                    do {
                      uVar21 = uVar10;
                      if (uVar9 < 100) {
                        uVar21 = uVar21 - 2;
                        goto LAB_00105e46;
                      }
                      if (uVar9 < 1000) {
                        uVar21 = uVar21 - 1;
                        goto LAB_00105e46;
                      }
                      if (uVar9 < 10000) goto LAB_00105e46;
                      bVar6 = 99999 < uVar9;
                      uVar9 = uVar9 / 10000;
                      uVar10 = uVar21 + 4;
                    } while (bVar6);
                    uVar21 = uVar21 + 1;
                  }
LAB_00105e46:
                  local_d8 = local_c8;
                  std::__cxx11::string::_M_construct((ulong)&local_d8,(char)uVar21);
                  std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_d8,uVar21,uVar27);
                  pdVar26 = (pointer)0xf;
                  if (local_190 != &local_180) {
                    pdVar26 = local_180;
                  }
                  if (pdVar26 < (pointer)(local_d0 + local_188)) {
                    pdVar26 = (pointer)0xf;
                    if (local_d8 != local_c8) {
                      pdVar26 = local_c8[0];
                    }
                    if (pdVar26 < (pointer)(local_d0 + local_188)) goto LAB_00105ee5;
                    puVar12 = (undefined8 *)
                              std::__cxx11::string::replace
                                        ((ulong)&local_d8,0,(char *)0x0,(ulong)local_190);
                  }
                  else {
LAB_00105ee5:
                    puVar12 = (undefined8 *)
                              std::__cxx11::string::_M_append((char *)&local_190,(ulong)local_d8);
                  }
                  local_170 = &local_160;
                  plVar13 = puVar12 + 2;
                  if ((long *)*puVar12 == plVar13) {
                    local_160 = *plVar13;
                    uStack_158 = puVar12[3];
                  }
                  else {
                    local_160 = *plVar13;
                    local_170 = (long *)*puVar12;
                  }
                  local_168 = puVar12[1];
                  *puVar12 = plVar13;
                  puVar12[1] = 0;
                  *(undefined1 *)plVar13 = 0;
                  plVar13 = (long *)std::__cxx11::string::append((char *)&local_170);
                  local_228 = (undefined1  [8])local_218;
                  puVar20 = (ulong *)(plVar13 + 2);
                  if ((ulong *)*plVar13 == puVar20) {
                    local_218 = (undefined1  [8])*puVar20;
                    aStack_210._M_allocated_capacity = plVar13[3];
                  }
                  else {
                    local_218 = (undefined1  [8])*puVar20;
                    local_228 = (undefined1  [8])*plVar13;
                  }
                  local_220._M_p = (pointer)plVar13[1];
                  *plVar13 = (long)puVar20;
                  plVar13[1] = 0;
                  *(undefined1 *)(plVar13 + 2) = 0;
                  uVar21 = 1;
                  if (9 < (uint)__val._M_head_impl) {
                    uVar11 = (ulong)(uint)__val._M_head_impl;
                    uVar9 = 4;
                    do {
                      uVar21 = uVar9;
                      uVar10 = (uint)uVar11;
                      if (uVar10 < 100) {
                        uVar21 = uVar21 - 2;
                        goto LAB_00106004;
                      }
                      if (uVar10 < 1000) {
                        uVar21 = uVar21 - 1;
                        goto LAB_00106004;
                      }
                      if (uVar10 < 10000) goto LAB_00106004;
                      uVar11 = uVar11 / 10000;
                      uVar9 = uVar21 + 4;
                    } while (99999 < uVar10);
                    uVar21 = uVar21 + 1;
                  }
LAB_00106004:
                  local_f8 = local_e8;
                  std::__cxx11::string::_M_construct((ulong)&local_f8,(char)uVar21);
                  std::__detail::__to_chars_10_impl<unsigned_int>
                            ((char *)local_f8,uVar21,__val._M_head_impl);
                  this = local_1f8;
                  auVar25 = (undefined1  [8])(pointer)0xf;
                  if (local_228 != (undefined1  [8])local_218) {
                    auVar25 = local_218;
                  }
                  if ((ulong)auVar25 < local_220._M_p + local_f0) {
                    pdVar26 = (pointer)0xf;
                    if (local_f8 != local_e8) {
                      pdVar26 = local_e8[0];
                    }
                    if (pdVar26 < local_220._M_p + local_f0) goto LAB_00106095;
                    puVar12 = (undefined8 *)
                              std::__cxx11::string::replace
                                        ((ulong)&local_f8,0,(char *)0x0,(ulong)local_228);
                  }
                  else {
LAB_00106095:
                    puVar12 = (undefined8 *)
                              std::__cxx11::string::_M_append(local_228,(ulong)local_f8);
                  }
                  local_1b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start =
                       (pointer)&local_1b8.super__Vector_base<double,_std::allocator<double>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage;
                  plVar13 = puVar12 + 2;
                  if ((pointer *)*puVar12 == (pointer *)plVar13) {
                    local_1b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage = (pointer)*plVar13;
                    uStack_1a0 = puVar12[3];
                  }
                  else {
                    local_1b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage = (pointer)*plVar13;
                    local_1b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start = (pointer)*puVar12;
                  }
                  local_1b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish = (pointer)puVar12[1];
                  *puVar12 = plVar13;
                  puVar12[1] = 0;
                  *(undefined1 *)plVar13 = 0;
                  if (local_f8 != local_e8) {
                    operator_delete(local_f8,(long)local_e8[0] + 1);
                  }
                  if (local_228 != (undefined1  [8])local_218) {
                    operator_delete((void *)local_228,(long)local_218 + 1);
                  }
                  if (local_170 != &local_160) {
                    operator_delete(local_170,local_160 + 1);
                  }
                  if (local_d8 != local_c8) {
                    operator_delete(local_d8,(long)local_c8[0] + 1);
                  }
                  if (local_190 != &local_180) {
                    operator_delete(local_190,(long)local_180 + 1);
                  }
                  if (local_70 != &local_60) {
                    operator_delete(local_70,local_60 + 1);
                  }
                  if (local_50[0] != local_40) {
                    operator_delete(local_50[0],local_40[0] + 1);
                  }
                  local_228 = (undefined1  [8])local_218;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)local_228,
                             local_1b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start,
                             (undefined1 *)
                             ((long)local_1b8.super__Vector_base<double,_std::allocator<double>_>.
                                    _M_impl.super__Vector_impl_data._M_finish +
                             (long)local_1b8.super__Vector_base<double,_std::allocator<double>_>.
                                   _M_impl.super__Vector_impl_data._M_start));
                  aStack_210._8_4_ = _Var28._M_head_impl;
                  std::
                  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::_Select1st<std::pair<std::__cxx11::string_const,int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
                  ::_M_insert_unique<std::pair<std::__cxx11::string_const,int>>
                            (local_108,
                             (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
                              *)local_228);
                  if (local_228 != (undefined1  [8])local_218) {
                    operator_delete((void *)local_228,(long)local_218 + 1);
                  }
                  local_228._4_4_ = __val._M_head_impl;
                  local_228._0_4_ = _Var28._M_head_impl;
                  local_220._M_p._4_4_ = (int)local_198;
                  local_220._M_p._0_4_ = uVar27;
                  local_218[3] = local_1bc;
                  local_218._1_2_ = local_1be;
                  local_218[0] = 1;
                  std::
                  _Rb_tree<int,std::pair<int_const,std::tuple<bool,int,int,int>>,std::_Select1st<std::pair<int_const,std::tuple<bool,int,int,int>>>,std::less<int>,std::allocator<std::pair<int_const,std::tuple<bool,int,int,int>>>>
                  ::_M_insert_unique<std::pair<int_const,std::tuple<bool,int,int,int>>>
                            (local_110,
                             (pair<const_int,_std::tuple<bool,_int,_int,_int>_> *)local_228);
                  local_228 = (undefined1  [8])local_218;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)local_228,
                             local_1b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start,
                             (undefined1 *)
                             ((long)local_1b8.super__Vector_base<double,_std::allocator<double>_>.
                                    _M_impl.super__Vector_impl_data._M_finish +
                             (long)local_1b8.super__Vector_base<double,_std::allocator<double>_>.
                                   _M_impl.super__Vector_impl_data._M_start));
                  aStack_210._12_4_ = uVar27;
                  local_200._M_head_impl = (int)local_198;
                  local_1fc._M_head_impl = true;
                  local_1f9 = local_1bc;
                  local_1fb = local_1be;
                  aStack_210._8_4_ = __val._M_head_impl;
                  std::
                  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::tuple<bool,int,int,int>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::tuple<bool,int,int,int>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::tuple<bool,int,int,int>>>>
                  ::
                  _M_insert_unique<std::pair<std::__cxx11::string_const,std::tuple<bool,int,int,int>>>
                            (local_118,
                             (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<bool,_int,_int,_int>_>
                              *)local_228);
                  if (local_228 != (undefined1  [8])local_218) {
                    operator_delete((void *)local_228,(long)local_218 + 1);
                  }
                  local_220._M_p = local_218 + 8;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_220,
                             local_1b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start,
                             (undefined1 *)
                             ((long)local_1b8.super__Vector_base<double,_std::allocator<double>_>.
                                    _M_impl.super__Vector_impl_data._M_finish +
                             (long)local_1b8.super__Vector_base<double,_std::allocator<double>_>.
                                   _M_impl.super__Vector_impl_data._M_start));
                  std::
                  _Rb_tree<int,std::pair<int_const,std::__cxx11::string>,std::_Select1st<std::pair<int_const,std::__cxx11::string>>,std::less<int>,std::allocator<std::pair<int_const,std::__cxx11::string>>>
                  ::_M_insert_unique<std::pair<int_const,std::__cxx11::string>>
                            (local_120,
                             (pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)local_228);
                  if (local_220._M_p != local_218 + 8) {
                    operator_delete(local_220._M_p,aStack_210._0_8_ + 1);
                  }
                  if ((pointer *)
                      local_1b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start !=
                      &local_1b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage) {
                    operator_delete(local_1b8.super__Vector_base<double,_std::allocator<double>_>.
                                    _M_impl.super__Vector_impl_data._M_start,
                                    (long)local_1b8.
                                          super__Vector_base<double,_std::allocator<double>_>.
                                          _M_impl.super__Vector_impl_data._M_end_of_storage + 1);
                  }
                  __val._M_head_impl = __val._M_head_impl + 1;
                  _Var28._M_head_impl = _Var28._M_head_impl + 1;
                  piVar14 = (this->_Arch).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start;
                } while (__val._M_head_impl < piVar14[local_100 - 2]);
              }
              if ((pointer *)local_1e8._0_8_ !=
                  &local_1e8._Matrix.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish) {
                operator_delete((void *)local_1e8._0_8_,
                                (long)local_1e8._Matrix.
                                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                      super__Vector_impl_data._M_finish + 1);
                piVar14 = (this->_Arch).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start;
              }
              uVar27 = uVar27 + 1;
              uVar17 = local_198;
            } while ((int)uVar27 < piVar14[local_198]);
          }
          uVar11 = uVar17;
          piVar24 = local_b0;
          Report = local_b8;
        } while (2 < (long)local_100);
      }
    }
  }
  OVar3 = this->_OutputFunc;
  if (OVar3 == ACTIVATION) {
    std::function<double_(const_double_&)>::operator=
              ((function<double_(const_double_&)> *)local_130,
               (function<double_(const_double_&)> *)local_a8);
    std::function<double_(const_double_&)>::operator=
              ((function<double_(const_double_&)> *)local_128,
               (function<double_(const_double_&)> *)local_a0);
  }
  else if (OVar3 == LINEAR) {
    std::function<double(double_const&)>::operator=
              ((function<double(double_const&)> *)local_130->_M_pod_data,
               (anon_class_1_0_00000001 *)local_228);
    std::function<double(double_const&)>::operator=
              ((function<double(double_const&)> *)local_128->_M_pod_data,
               (anon_class_1_0_00000001 *)local_228);
  }
  else if (OVar3 == QUADRATIC) {
    std::function<double(double_const&)>::operator=
              ((function<double(double_const&)> *)local_130->_M_pod_data,
               (anon_class_1_0_00000001 *)local_228);
    std::function<double(double_const&)>::operator=
              ((function<double(double_const&)> *)local_128->_M_pod_data,
               (anon_class_1_0_00000001 *)local_228);
  }
  if ((this->_Preproc).super__Function_base._M_manager != (_Manager_type)0x0) {
    local_1e8._0_8_ = (pointer **)0x0;
    local_1e8._Matrix.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start = (double *)0x0;
    local_1e8._Matrix.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    if (0 < *(this->_Arch).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start) {
      iVar22 = 0;
      do {
        iVar8 = rand();
        local_228 = (undefined1  [8])((double)(iVar8 % 100) * 0.01);
        if (local_1e8._Matrix.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start ==
            local_1e8._Matrix.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                    ((vector<double,_std::allocator<double>_> *)&local_1e8,
                     (iterator)
                     local_1e8._Matrix.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start,(double *)local_228);
        }
        else {
          *local_1e8._Matrix.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start = (double)local_228;
          local_1e8._Matrix.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start =
               local_1e8._Matrix.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start + 1;
        }
        iVar22 = iVar22 + 1;
      } while (iVar22 < *(this->_Arch).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start);
      if ((this->_Preproc).super__Function_base._M_manager == (_Manager_type)0x0) {
        uVar16 = std::__throw_bad_function_call();
        if (local_228 != (undefined1  [8])local_228) {
          operator_delete((void *)local_228,(long)local_218 + 1);
        }
        pFVar7 = local_1f8;
        if (local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != (pointer)0x0) {
          operator_delete(local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        std::
        _Rb_tree<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)local_120);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
        ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                     *)local_108);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<bool,_int,_int,_int>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<bool,_int,_int,_int>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<bool,_int,_int,_int>_>_>_>
        ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<bool,_int,_int,_int>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<bool,_int,_int,_int>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<bool,_int,_int,_int>_>_>_>
                     *)local_118);
        std::
        _Rb_tree<int,_std::pair<const_int,_std::tuple<bool,_int,_int,_int>_>,_std::_Select1st<std::pair<const_int,_std::tuple<bool,_int,_int,_int>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::tuple<bool,_int,_int,_int>_>_>_>
        ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_std::tuple<bool,_int,_int,_int>_>,_std::_Select1st<std::pair<const_int,_std::tuple<bool,_int,_int,_int>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::tuple<bool,_int,_int,_int>_>_>_>
                     *)local_110);
        std::
        _Rb_tree<int,_std::pair<const_int,_nnad::Matrix<double>_>,_std::_Select1st<std::pair<const_int,_nnad::Matrix<double>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_nnad::Matrix<double>_>_>_>
        ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_nnad::Matrix<double>_>,_std::_Select1st<std::pair<const_int,_nnad::Matrix<double>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_nnad::Matrix<double>_>_>_>
                     *)local_88);
        std::
        _Rb_tree<int,_std::pair<const_int,_nnad::Matrix<double>_>,_std::_Select1st<std::pair<const_int,_nnad::Matrix<double>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_nnad::Matrix<double>_>_>_>
        ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_nnad::Matrix<double>_>,_std::_Select1st<std::pair<const_int,_nnad::Matrix<double>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_nnad::Matrix<double>_>_>_>
                     *)local_80);
        p_Var5 = (pFVar7->_dOutputActFun).super__Function_base._M_manager;
        if (p_Var5 != (_Manager_type)0x0) {
          (*p_Var5)(local_128,local_128,__destroy_functor);
        }
        p_Var5 = (pFVar7->_OutputActFun).super__Function_base._M_manager;
        if (p_Var5 != (_Manager_type)0x0) {
          (*p_Var5)(local_130,local_130,__destroy_functor);
        }
        pdVar26 = (local_90->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        if (pdVar26 != (pointer)0x0) {
          operator_delete(pdVar26,(long)(pFVar7->_PreprocPars).
                                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                        super__Vector_impl_data._M_end_of_storage - (long)pdVar26);
        }
        p_Var5 = (pFVar7->_Preproc).super__Function_base._M_manager;
        if (p_Var5 != (_Manager_type)0x0) {
          (*p_Var5)(local_98,local_98,__destroy_functor);
        }
        p_Var5 = (pFVar7->_dActFun).super__Function_base._M_manager;
        if (p_Var5 != (_Manager_type)0x0) {
          (*p_Var5)(local_a0,local_a0,__destroy_functor);
        }
        p_Var5 = (pFVar7->_ActFun).super__Function_base._M_manager;
        if (p_Var5 != (_Manager_type)0x0) {
          (*p_Var5)(local_a8,local_a8,__destroy_functor);
        }
        piVar14 = (pFVar7->_Arch).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        if (piVar14 != (pointer)0x0) {
          operator_delete(piVar14,(long)(pFVar7->_Arch).
                                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                        super__Vector_impl_data._M_end_of_storage - (long)piVar14);
        }
        _Unwind_Resume(uVar16);
      }
    }
    (*(this->_Preproc)._M_invoker)
              (&local_1b8,local_98,(vector<double,_std::allocator<double>_> *)&local_1e8,local_90);
    if ((this->_NpPrep + 1) *
        (this->_Arch).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish[-1] !=
        (int)((ulong)((long)local_1b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                     (long)local_1b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start) >> 3)) {
LAB_001068b6:
      local_228 = (undefined1  [8])local_218;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_228,"FeedForwardNN: preprocessing function not well-formed.","");
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"\x1b[1;31mERROR: ",0xe);
      poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,(char *)local_228,(long)local_220._M_p);
      std::__ostream_insert<char,std::char_traits<char>>(poVar15,"\x1b[0m",4);
      std::endl<char,std::char_traits<char>>(poVar15);
      goto LAB_00106921;
    }
    if ((pointer *)
        local_1b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer *)0x0) {
      operator_delete(local_1b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_1b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_1b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if ((pointer **)local_1e8._0_8_ != (pointer **)0x0) {
      operator_delete((void *)local_1e8._0_8_,
                      (long)local_1e8._Matrix.super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_finish - local_1e8._0_8_);
    }
  }
  if (*Report == true) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"\nFeed-forward neural network initialised:",0x29);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x18);
    std::ostream::put(-0x18);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"- architecture = [ ",0x13);
    piVar4 = (this->_Arch).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (piVar30 = (this->_Arch).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start; piVar30 != piVar4; piVar30 = piVar30 + 1) {
      poVar15 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,*piVar30);
      std::__ostream_insert<char,std::char_traits<char>>(poVar15," ",1);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"]",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x18);
    std::ostream::put(-0x18);
    std::ostream::flush();
    if ((this->_Preproc).super__Function_base._M_manager == (_Manager_type)0x0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"- number of parameters = ",0x19);
      poVar15 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,*piVar24);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar15 + -0x18) + (char)poVar15);
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"- preprocessing function provided",0x21);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x18);
      std::ostream::put(-0x18);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"- number of parameters (NN + preprocessing) = ",0x2e);
      poVar15 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,*piVar24);
      std::__ostream_insert<char,std::char_traits<char>>(poVar15," + ",3);
      poVar15 = (ostream *)std::ostream::operator<<(poVar15,this->_NpPrep);
      std::__ostream_insert<char,std::char_traits<char>>(poVar15," (",2);
      poVar15 = (ostream *)std::ostream::operator<<(poVar15,this->_NpPrep + this->_Np);
      std::__ostream_insert<char,std::char_traits<char>>(poVar15,")",1);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar15 + -0x18) + (char)poVar15);
    }
    std::ostream::put((char)poVar15);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"- NN output function: ",0x16);
    uVar11 = (ulong)this->_OutputFunc;
    if (2 < uVar11) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"unknown",7);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x18);
      std::ostream::put(-0x18);
      std::ostream::flush();
      local_228 = (undefined1  [8])local_218;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_228,"FeedForwardNN: Unknown output function.","");
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"\x1b[1;31mERROR: ",0xe);
      poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,(char *)local_228,(long)local_220._M_p);
      std::__ostream_insert<char,std::char_traits<char>>(poVar15,"\x1b[0m",4);
      std::endl<char,std::char_traits<char>>(poVar15);
LAB_00106921:
      exit(-10);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,&DAT_001090b8 + *(int *)(&DAT_001090b8 + uVar11 * 4),
               *(long *)(&DAT_001090c8 + uVar11 * 8));
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x18);
    std::ostream::put(-0x18);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
  }
  if (local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

FeedForwardNN(std::vector<int>           const& Arch,
                  int                        const& RandomSeed,
                  bool                       const& Report = false,
                  std::function<T(T const&)> const& ActFun = Sigmoid<T>,
                  std::function<T(T const&)> const& dActFun = dSigmoid<T>,
                  OutputFunction             const& OutputFunc = LINEAR,
                  Preprocessing              const& Preproc = nullptr,
                  std::vector<T>             const& PreprocPars = {}):
      _Arch(Arch),
      _ActFun(ActFun),
      _dActFun(dActFun),
      _OutputFunc(OutputFunc),
      _Preproc(Preproc),
      _PreprocPars(_Preproc == nullptr ? std::vector<T> {} : PreprocPars),
      _NpPrep((int) _PreprocPars.size())
    {
      // Number of layers
      const int nl = (int) _Arch.size();

      // Store sub seeds
      srand(RandomSeed);
      std::vector<int> sub_seeds;
      for (int l = 1; l < nl; l++)
        {
          sub_seeds.push_back(rand());
          sub_seeds.push_back(rand());
        }

      // Number of parameters of the NN
      _Np = 0;

      // Initialise links and biases with random numbers. Links are
      // treated as matrices that connect consecutive layers with as
      // many rows as nodes of the rightmost layer and as many columns
      // as the leftmost layer. Biases are treated as one-column
      // matrices associated to each layer (but the input one) with as
      // many rows as nodes.
      int iseed = 0;
      for (int l = 1; l < nl; l++)
        {
          _Links.insert({l, Matrix<T>{_Arch[l], _Arch[l - 1], sub_seeds.at(iseed++)}});
          _Biases.insert({l, Matrix<T>{_Arch[l], 1, sub_seeds.at(iseed++)}});
          _Np += _Arch[l] * (_Arch[l - 1] + 1);
        }

      // Construct maps that index the free parameters. Each parameter is
      // associated to an integer and a string.
      int count = 0;
      for (int l = nl - 1; l > 0; l--)
        for (int i = 0; i < _Arch[l]; i++)
          {
            // Biases
            const coordinates coord = std::make_tuple(false, l, i, 0);
            const std::string name = "B_" + std::to_string(l) + "_" + std::to_string(i);
            _StrIntMap.insert({name, count});
            _IntMap.insert({count, coord});
            _StrMap.insert({name, coord});
            _IntStrMap.insert({count++, name});

            // Links
            for (int j = 0; j < _Arch[l - 1]; j++)
              {
                const coordinates coord = std::make_tuple(true, l, i, j);
                const std::string name = "L_" + std::to_string(l) + "_" + std::to_string(i) + "_" + std::to_string(j);
                _StrIntMap.insert({name, count});
                _IntMap.insert({count, coord});
                _StrMap.insert({name, coord});
                _IntStrMap.insert({count++, name});
              }
          }

      // Define activation function of the output nodes and its
      // derivative.
      switch (_OutputFunc)
        {
        case ACTIVATION:
          _OutputActFun  = _ActFun;
          _dOutputActFun = _dActFun;
          break;
        case LINEAR:
          _OutputActFun  = [] (T const& x) -> T { return x; };
          _dOutputActFun = [] (T const&)   -> T { return T{1}; };
          break;
        case QUADRATIC:
          _OutputActFun  = [] (T const& x) -> T { return x * x; };
          _dOutputActFun = [] (T const& x) -> T { return 2 * x; };
          break;
        }

      // Check sanity of preprocessing function, if present
      if (_Preproc != nullptr)
        {
          // Generate random inputs between 0 and 1 but recasted as T
          std::vector<T> InPrep;
          for (int i = 0; i < _Arch.front(); i++)
            InPrep.push_back(T{1e-2 * ( rand() % 100 )});

          // Test preprocessing function
          const std::vector<T> OutPrep = _Preproc(InPrep, _PreprocPars);

          // Check that the number of outputs of the preprocessing
          // function is the same as that of the NN.
          if ((int) OutPrep.size() != ( _NpPrep + 1 ) * _Arch.back())
            Error("FeedForwardNN: preprocessing function not well-formed.");
        }

      // Report NN parameters
      if (Report)
        {
          std::cout << "\nFeed-forward neural network initialised:" << std::endl;
          std::cout << "- architecture = [ ";
          for (auto const& n : _Arch)
            std::cout << n << " ";
          std::cout << "]" << std::endl;
          if (_Preproc != nullptr)
            {
              std::cout << "- preprocessing function provided" << std::endl;
              std::cout << "- number of parameters (NN + preprocessing) = " << _Np << " + " << _NpPrep << " (" << _Np + _NpPrep << ")" << std::endl;
            }
          else
            std::cout << "- number of parameters = " << _Np << std::endl;
          std::cout << "- NN output function: ";
          switch (_OutputFunc)
            {
            case ACTIVATION:
              std::cout << "activation-like" << std::endl;
              break;
            case LINEAR:
              std::cout << "linear" << std::endl;
              break;
            case QUADRATIC:
              std::cout << "quadratic" << std::endl;
              break;
            default:
              std::cout << "unknown" << std::endl;
              Error("FeedForwardNN: Unknown output function.");
            }
          std::cout << "\n";
        }
    }